

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval *
deqp::gls::BuiltinPrecisionTests::ScalarTraits<float>::doMakeIVal
          (Interval *__return_storage_ptr__,float *value)

{
  float *value_local;
  
  tcu::Interval::Interval(__return_storage_ptr__,(double)*value);
  return __return_storage_ptr__;
}

Assistant:

static Interval		doMakeIVal		(const T& value)
	{
		// Thankfully all scalar types have a well-defined conversion to `double`,
		// hence Interval can represent their ranges without problems.
		return Interval(double(value));
	}